

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

void processEvent(SWindowData *window_data,XEvent *event)

{
  uint uVar1;
  void *pvVar2;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  mfb_mouse_move_func UNRECOVERED_JUMPTABLE_00;
  mfb_active_func UNRECOVERED_JUMPTABLE;
  mfb_mouse_scroll_func UNRECOVERED_JUMPTABLE_01;
  mfb_key_mod mVar6;
  uint32_t uVar7;
  mfb_key key;
  uint uVar8;
  mfb_mouse_button mVar9;
  mfb_mouse_button_func UNRECOVERED_JUMPTABLE_02;
  float fVar10;
  float fVar11;
  XEvent nev;
  ulong local_e0 [7];
  Time local_a8;
  uint local_8c;
  
  iVar4 = event->type;
  switch(iVar4) {
  case 3:
    pvVar2 = window_data->specific;
    iVar4 = XEventsQueued(*(undefined8 *)((long)pvVar2 + 8),1);
    if (iVar4 != 0) {
      XPeekEvent(*(undefined8 *)((long)pvVar2 + 8),local_e0);
      if ((((uint)local_e0[0] == 2) && (local_a8 == (event->xkey).time)) &&
         (local_8c == (event->xkey).keycode)) {
        return;
      }
    }
  case 2:
    key = KB_KEY_UNKNOWN;
    if ((ulong)(event->xkey).keycode < 0x100) {
      key = (mfb_key)g_keycodes[(event->xkey).keycode];
    }
    iVar4 = event->type;
    uVar5 = translate_mod_ex(key,(event->xcrossing).mode,(uint)(iVar4 == 2));
    window_data->mod_keys = uVar5;
    window_data->key_status[key] = iVar4 == 2;
    if (window_data->keyboard_func != (mfb_keyboard_func)0x0) {
      (*window_data->keyboard_func)((mfb_window *)window_data,key,window_data->mod_keys,iVar4 == 2);
    }
    if (event->type == 2) {
      XLookupString(event,0,0,local_e0,0);
      uVar8 = (uint)local_e0[0];
      if (local_e0[0] - 0x20 < 0x5f || local_e0[0] - 0xa0 < 0x60) {
        if (window_data->char_input_func != (mfb_char_input_func)0x0) {
          (*window_data->char_input_func)((mfb_window *)window_data,uVar8);
        }
      }
      else if ((uVar8 & 0xff000000) == 0x1000000) {
        local_e0[0] = (ulong)(uVar8 & 0xffffff);
      }
      if (window_data->char_input_func != (mfb_char_input_func)0x0) {
        (*window_data->char_input_func)((mfb_window *)window_data,(uint)local_e0[0]);
      }
    }
    break;
  case 4:
  case 5:
    uVar8 = (event->xkey).state;
    uVar1 = (event->xkey).keycode;
    mVar6 = (uVar8 >> 3 & 8 | uVar8 >> 1 & 6 | uVar8 & 1) + (uVar8 & 2) * 8 + (uVar8 & 0x10) * 2;
    window_data->mod_keys = mVar6;
    switch(uVar1) {
    case 1:
      mVar9 = MOUSE_BTN_1;
      break;
    case 2:
      mVar9 = MOUSE_BTN_3;
      break;
    case 3:
      mVar9 = MOUSE_BTN_2;
      break;
    case 4:
      window_data->mouse_wheel_y = 1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar11 = 1.0;
      goto LAB_00103b70;
    case 5:
      window_data->mouse_wheel_y = -1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar11 = -1.0;
LAB_00103b70:
      fVar10 = 0.0;
LAB_00103c16:
      (*UNRECOVERED_JUMPTABLE_01)((mfb_window *)window_data,mVar6,fVar10,fVar11);
      return;
    case 6:
      window_data->mouse_wheel_x = 1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar10 = 1.0;
      goto LAB_00103c13;
    case 7:
      window_data->mouse_wheel_x = -1.0;
      UNRECOVERED_JUMPTABLE_01 = window_data->mouse_wheel_func;
      if (UNRECOVERED_JUMPTABLE_01 == (mfb_mouse_scroll_func)0x0) {
        return;
      }
      fVar10 = -1.0;
LAB_00103c13:
      fVar11 = 0.0;
      goto LAB_00103c16;
    default:
      mVar9 = uVar1 - MOUSE_BTN_4;
      window_data->mouse_button_status[mVar9 & MOUSE_BTN_7] = iVar4 == 4;
      UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
      if (UNRECOVERED_JUMPTABLE_02 == (mfb_mouse_button_func)0x0) {
        return;
      }
      goto LAB_00103bcb;
    }
    window_data->mouse_button_status[mVar9] = iVar4 == 4;
    UNRECOVERED_JUMPTABLE_02 = window_data->mouse_btn_func;
    if (UNRECOVERED_JUMPTABLE_02 != (mfb_mouse_button_func)0x0) {
LAB_00103bcb:
      (*UNRECOVERED_JUMPTABLE_02)((mfb_window *)window_data,mVar9,mVar6,iVar4 == 4);
      return;
    }
    break;
  case 6:
    window_data->mouse_pos_x = (event->xkey).x;
    uVar7 = (event->xkey).y;
    window_data->mouse_pos_y = uVar7;
    UNRECOVERED_JUMPTABLE_00 = window_data->mouse_move_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar5 = (event->xkey).x;
LAB_001039a0:
      (*UNRECOVERED_JUMPTABLE_00)((mfb_window *)window_data,uVar5,uVar7);
      return;
    }
    break;
  case 7:
  case 8:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    break;
  case 9:
    window_data->is_active = true;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var3 = true;
LAB_00103ae6:
      (*UNRECOVERED_JUMPTABLE)((mfb_window *)window_data,_Var3);
      return;
    }
    break;
  case 10:
    window_data->is_active = false;
    UNRECOVERED_JUMPTABLE = window_data->active_func;
    if (UNRECOVERED_JUMPTABLE != (mfb_active_func)0x0) {
      _Var3 = false;
      goto LAB_00103ae6;
    }
    break;
  case 0x16:
    window_data->window_width = (event->xexpose).count;
    uVar5 = (event->xgraphicsexpose).major_code;
    window_data->window_height = uVar5;
    resize_dst(window_data,(event->xexpose).count,uVar5);
    resize_GL(window_data);
    UNRECOVERED_JUMPTABLE_00 = window_data->resize_func;
    if (UNRECOVERED_JUMPTABLE_00 != (mfb_mouse_move_func)0x0) {
      uVar5 = window_data->window_width;
      uVar7 = window_data->window_height;
      goto LAB_001039a0;
    }
    break;
  default:
    if (iVar4 != 0x21) {
      return;
    }
    if ((event->xkey).time != s_delete_window_atom) {
      return;
    }
    if ((window_data->close_func != (mfb_close_func)0x0) &&
       (_Var3 = (*window_data->close_func)((mfb_window *)window_data), !_Var3)) {
      return;
    }
  case 0x11:
    window_data->close = true;
  }
  return;
}

Assistant:

static void
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease:
        {
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if ((event->type == KeyRelease) &&
                XEventsQueued(window_data_x11->display, QueuedAfterReading)) {
                XEvent nev;
                XPeekEvent(window_data_x11->display, &nev);

                if ((nev.type == KeyPress) && (nev.xkey.time == event->xkey.time) &&
                    (nev.xkey.keycode == event->xkey.keycode)) {
                    /* Key wasn’t actually released */
                    return;
                }
            }

            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);

            if(event->type == KeyPress) {
                KeySym keysym;
                XLookupString(&event->xkey, NULL, 0, &keysym, NULL);

                if ((keysym >= 0x0020 && keysym <= 0x007e) ||
                    (keysym >= 0x00a0 && keysym <= 0x00ff)) {
                    kCall(char_input_func, keysym);
                }
                else if ((keysym & 0xff000000) == 0x01000000) {
                    keysym = keysym & 0x00ffffff;
                }

                kCall(char_input_func, keysym);

                // TODO: Investigate a bit more the xkbcommon api

                // This does not seem to be working properly
                //unsigned int codepoint = xkb_state_key_get_utf32(state, keysym);
                //if (codepoint != 0)
                //    kCall(char_input_func, codepoint);
            }
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);

            // Swap mouse right and middle for parity with other platforms:
            // https://github.com/emoon/minifb/issues/65
            switch (button) {
                case Button2:
                    button = Button3;
                    break;
                case Button3:
                    button = Button2;
                    break;
            }

            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    window_data->mouse_button_status[button & 0x07] = is_pressed;
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    window_data->mouse_wheel_y = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;
                case Button5:
                    window_data->mouse_wheel_y = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;

                case 6:
                    window_data->mouse_wheel_x = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;
                case 7:
                    window_data->mouse_wheel_x = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;

                default:
                    window_data->mouse_button_status[(button - 4) & 0x07] = is_pressed;
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify:
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;

        case ClientMessage:
        {
            if ((Atom)event->xclient.data.l[0] == s_delete_window_atom) {
                if (window_data) {
                    bool destroy = false;

                    // Obtain a confirmation of close
                    if (!window_data->close_func || window_data->close_func((struct mfb_window*)window_data)) {
                        destroy = true;
                    }

                    if (destroy) {
                        window_data->close = true;
                        return;
                    }
                }
            }
        }
        break;
    }
}